

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * luaH_newkey(lua_State *L,Table *t,TValue *key)

{
  Node *pNVar1;
  int *piVar2;
  int iVar3;
  Node *pNVar4;
  Value VVar5;
  undefined8 uVar6;
  uint uVar7;
  undefined4 uVar8;
  ulong uVar9;
  int lg;
  int iVar10;
  Node *pNVar11;
  Node *pNVar12;
  Node *pNVar13;
  ulong uVar14;
  TValue *pTVar15;
  long lVar16;
  uint ttlg;
  uint uVar17;
  long lVar18;
  uint ause;
  int iVar19;
  uint uVar20;
  uint uVar21;
  char *fmt;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint twotoi;
  ulong uVar25;
  long lVar26;
  int local_dc;
  TValue aux;
  lua_Integer k;
  
  if (key->tt_ == 3) {
    iVar19 = luaV_tointeger(key,&k,0);
    if (iVar19 == 0) {
      if (NAN((key->value_).n)) {
        fmt = "table index is NaN";
        goto LAB_0011d4ee;
      }
    }
    else {
      key = &aux;
      aux.value_.i = k;
      aux.tt_ = 0x13;
    }
  }
  else if (key->tt_ == 0) {
    fmt = "table index is nil";
LAB_0011d4ee:
    luaG_runerror(L,fmt);
  }
  pNVar11 = mainposition(t,key);
  pNVar4 = t->lastfree;
  if ((pNVar11->i_val).tt_ == 0) {
    if (pNVar4 == (Node *)0x0) goto LAB_0011d2ff;
  }
  else {
    if (pNVar4 == (Node *)0x0) {
LAB_0011d2ff:
      for (lVar18 = 0; lVar18 != 0x20; lVar18 = lVar18 + 1) {
        *(undefined4 *)((long)&k + lVar18 * 4) = 0;
      }
      lVar18 = 0;
      uVar21 = 1;
      iVar19 = 0;
      uVar17 = 1;
      while ((lVar18 != 0x20 &&
             ((uVar23 = t->sizearray, uVar20 = uVar21, uVar21 <= uVar23 ||
              (uVar20 = uVar23, uVar17 <= uVar23))))) {
        uVar23 = uVar20 + 1;
        if (uVar20 + 1 < uVar17) {
          uVar23 = uVar17;
        }
        iVar22 = 0;
        for (uVar17 = uVar17 - 1; uVar17 - uVar23 != -1; uVar17 = uVar17 + 1) {
          iVar22 = (iVar22 + 1) - (uint)(t->array[uVar17].tt_ == 0);
        }
        piVar2 = (int *)((long)&k + lVar18 * 4);
        *piVar2 = *piVar2 + iVar22;
        iVar19 = iVar19 + iVar22;
        lVar18 = lVar18 + 1;
        uVar21 = uVar21 * 2;
        uVar17 = uVar23;
      }
      uVar25 = 1;
      lVar18 = (long)(1 << (t->lsizenode & 0x1f));
      iVar22 = 0;
      local_dc = 0;
      do {
        lVar26 = -lVar18;
        uVar9 = lVar18 << 5 | 0x10;
        do {
          uVar14 = uVar9;
          lVar26 = lVar26 + 1;
          if (lVar26 == 1) {
            iVar10 = countint(key,(uint *)&k);
            lVar18 = 0;
            uVar23 = 0;
            uVar21 = 0;
            uVar17 = 0;
            goto LAB_0011d400;
          }
          uVar9 = uVar14 - 0x20;
        } while (*(int *)((long)t->node + (uVar14 - 0x28)) == 0);
        iVar10 = countint((TValue *)((long)&t->node[-1].i_val.value_ + uVar14),(uint *)&k);
        iVar22 = iVar22 + iVar10;
        local_dc = local_dc + 1;
        lVar18 = -lVar26;
      } while( true );
    }
    lVar18 = 0;
    do {
      lVar26 = lVar18;
      if ((Node *)((long)&(pNVar4->i_val).value_ + lVar26) <= t->node) goto LAB_0011d2ff;
      t->lastfree = (Node *)((long)&pNVar4[-1].i_val.value_ + lVar26);
      lVar18 = lVar26 + -0x20;
    } while (*(int *)((long)pNVar4 + lVar26 + -8) != 0);
    pNVar12 = mainposition(t,&(pNVar11->i_key).tvk);
    pNVar1 = (Node *)((long)&pNVar4[-1].i_val.value_ + lVar26);
    if (pNVar12 == pNVar11) {
      lVar16 = (long)(pNVar11->i_key).nk.next;
      if (lVar16 != 0) {
        *(int *)((long)&pNVar4[-1].i_key + lVar26 + 0xc) =
             (int)((ulong)((long)pNVar11 + ((lVar16 * 0x20 - (long)pNVar4) - lVar18)) >> 5);
      }
      (pNVar11->i_key).nk.next = (int)((ulong)((long)pNVar4 + (lVar18 - (long)pNVar11)) >> 5);
      pNVar11 = pNVar1;
    }
    else {
      do {
        pNVar13 = pNVar12;
        pNVar12 = pNVar13 + (pNVar13->i_key).nk.next;
      } while (pNVar13 + (pNVar13->i_key).nk.next != pNVar11);
      (pNVar13->i_key).nk.next = (int)((ulong)((long)pNVar4 + (lVar18 - (long)pNVar13)) >> 5);
      VVar5 = (pNVar11->i_val).value_;
      iVar19 = (pNVar11->i_val).tt_;
      uVar8 = *(undefined4 *)&(pNVar11->i_val).field_0xc;
      uVar6 = *(undefined8 *)((long)&pNVar11->i_key + 8);
      (pNVar1->i_key).nk.value_ = (pNVar11->i_key).nk.value_;
      *(undefined8 *)((long)&pNVar1->i_key + 8) = uVar6;
      (pNVar1->i_val).value_ = VVar5;
      (pNVar1->i_val).tt_ = iVar19;
      *(undefined4 *)&(pNVar1->i_val).field_0xc = uVar8;
      if ((pNVar11->i_key).nk.next != 0) {
        piVar2 = (int *)((long)&pNVar4[-1].i_key + lVar26 + 0xc);
        *piVar2 = *piVar2 + (int)((ulong)((long)pNVar11 + (-lVar18 - (long)pNVar4)) >> 5);
        (pNVar11->i_key).nk.next = 0;
      }
      (pNVar11->i_val).tt_ = 0;
    }
  }
  (pNVar11->i_key).nk.value_ = key->value_;
  uVar21 = key->tt_;
  (pNVar11->i_key).nk.tt_ = uVar21;
  if ((uVar21 & 0x40) == 0) {
    return &pNVar11->i_val;
  }
  if ((t->marked & 4) == 0) {
    return &pNVar11->i_val;
  }
  if ((((key->value_).gc)->marked & 3) == 0) {
    return &pNVar11->i_val;
  }
  luaC_barrierback_(L,t);
  return &pNVar11->i_val;
LAB_0011d400:
  if (lVar18 == 0x20) {
LAB_0011d43d:
    luaH_resize(L,t,uVar17,((iVar19 + local_dc) - uVar21) + 1);
    pTVar15 = luaH_set(L,t,key);
    return pTVar15;
  }
  uVar20 = (uint)(uVar25 >> 1);
  if ((uint)(iVar10 + iVar22 + iVar19) <= uVar20) goto LAB_0011d43d;
  iVar3 = *(int *)((long)&k + lVar18 * 4);
  uVar23 = uVar23 + iVar3;
  uVar24 = uVar17;
  uVar7 = uVar21;
  if (uVar20 < uVar23) {
    uVar24 = (uint)uVar25;
    uVar7 = uVar23;
  }
  if (iVar3 != 0) {
    uVar17 = uVar24;
    uVar21 = uVar7;
  }
  lVar18 = lVar18 + 1;
  uVar25 = (ulong)((uint)uVar25 * 2);
  goto LAB_0011d400;
}

Assistant:

TValue *luaH_newkey (lua_State *L, Table *t, const TValue *key) {
  Node *mp;
  TValue aux;
  if (ttisnil(key)) luaG_runerror(L, "table index is nil");
  else if (ttisfloat(key)) {
    lua_Integer k;
    if (luaV_tointeger(key, &k, 0)) {  /* does index fit in an integer? */
      setivalue(&aux, k);
      key = &aux;  /* insert it as an integer */
    }
    else if (luai_numisnan(fltvalue(key)))
      luaG_runerror(L, "table index is NaN");
  }
  mp = mainposition(t, key);
  if (!ttisnil(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' takes care of TM cache */
      return luaH_set(L, t, key);  /* insert key into grown table */
    }
    lua_assert(!isdummy(t));
    othern = mainposition(t, gkey(mp));
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setnilvalue(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(L, &mp->i_key, key);
  luaC_barrierback(L, t, key);
  lua_assert(ttisnil(gval(mp)));
  return gval(mp);
}